

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceKinematicsScene.cpp
# Opt level: O3

void __thiscall
COLLADAFW::InstanceKinematicsScene::InstanceKinematicsScene
          (InstanceKinematicsScene *this,InstanceKinematicsScene *pre)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ObjectId OVar4;
  
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.super_Object._vptr_Object =
       (_func_int **)&PTR__ObjectTemplate_009b56a8;
  uVar2 = *(undefined4 *)
           &(pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
            super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.field_0x4;
  OVar4 = (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
          super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mObjectId;
  uVar3 = *(undefined4 *)
           ((long)&(pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
                   super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mObjectId
           + 4);
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mClassId =
       (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
       super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mClassId;
  *(undefined4 *)
   &(this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
    super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.field_0x4 = uVar2;
  *(int *)&(this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
           super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mObjectId =
       (int)OVar4;
  *(undefined4 *)
   ((long)&(this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
           super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mObjectId + 4) =
       uVar3;
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mFileId =
       (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
       super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.mUniqueId.mFileId;
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBase_009b5670;
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mName._M_dataplus._M_p =
       (pointer)&(this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mName.field_2;
  pcVar1 = (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mName,
             pcVar1,pcVar1 + (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mName
                             ._M_string_length);
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.mFileId =
       (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.
       mFileId;
  uVar2 = *(undefined4 *)
           &(pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.
            field_0x4;
  OVar4 = (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.
          mObjectId;
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.mClassId
       = (pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.
         mClassId;
  *(undefined4 *)
   &(this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.
    field_0x4 = uVar2;
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).mInstanciatedObjectId.mObjectId
       = OVar4;
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceKinematicsScene_009b55f0;
  (this->mBoundNodes)._vptr_Array = (_func_int **)&PTR_releaseMemory_00904e18;
  (this->mBoundNodes).mData = (UniqueId *)0x0;
  (this->mBoundNodes).mCount = 0;
  (this->mBoundNodes).mCapacity = 0;
  (this->mBoundNodes).mFlags = 3;
  (this->mNodeLinkBindings)._vptr_Array = (_func_int **)&PTR_releaseMemory_009b56d8;
  (this->mNodeLinkBindings).mData = (NodeLinkBinding *)0x0;
  (this->mNodeLinkBindings).mCount = 0;
  (this->mNodeLinkBindings).mCapacity = 0;
  (this->mNodeLinkBindings).mFlags = 3;
  this->mFileId = pre->mFileId;
  Array<COLLADAFW::UniqueId>::cloneArray(&pre->mBoundNodes,&this->mBoundNodes);
  Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>::cloneArray
            (&pre->mNodeLinkBindings,&this->mNodeLinkBindings);
  return;
}

Assistant:

InstanceKinematicsScene::InstanceKinematicsScene( const InstanceKinematicsScene& pre )
		: InstanceBase<COLLADA_TYPE::INSTANCE_KINEMATICS_SCENE>(pre)
		, mBoundNodes(UniqueIdArray::OWNER)
		, mNodeLinkBindings(NodeLinkBindingArray::OWNER)
		, mFileId(pre.mFileId)
	{
		pre.mBoundNodes.cloneArray(mBoundNodes);
		pre.mNodeLinkBindings.cloneArray(mNodeLinkBindings);
	}